

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::die(Player *this)

{
  int iVar1;
  undefined8 uVar2;
  ResourceManager *this_00;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  undefined1 auVar6 [16];
  
  shake();
  iVar5 = BB_H / 2;
  (this->super_Entity).x = (float)(BB_W / 2);
  (this->super_Entity).y = (float)iVar5;
  (this->super_Entity).dx = 0.0;
  (this->super_Entity).dy = 0.0;
  this->angle = -1.5707964;
  this->draw_trail = false;
  this->weapon = 0;
  iVar5 = this->lives;
  this->lives = iVar5 + -1;
  if (iVar5 < 2) {
    (this->super_Entity).isDestructable = false;
    this->invincibleCount = 8000;
    uVar2 = al_get_target_bitmap();
    al_set_target_bitmap(this->highscoreBitmap);
    iVar5 = al_get_bitmap_width(this->highscoreBitmap);
    iVar1 = al_get_bitmap_height(this->highscoreBitmap);
    this_00 = ResourceManager::getInstance();
    pvVar3 = ResourceManager::getData(this_00,3);
    pvVar4 = ResourceManager::getData(this_00,4);
    al_map_rgb(0xff,0xff,0xff);
    al_draw_textf(pvVar3,1,"GAME OVER");
    auVar6 = al_map_rgb(0xff,0xff,0xff);
    al_draw_textf(auVar6._0_8_,auVar6._8_8_,(float)(iVar5 / 2),(float)(iVar1 / 2 + 0x10),pvVar4,1,
                  "%d Points",this->score);
    al_set_target_bitmap(uVar2);
    return;
  }
  (this->super_Entity).hp = 1;
  (this->super_Entity).isDestructable = false;
  this->invincibleCount = 3000;
  return;
}

Assistant:

void Player::die(void)
{
   shake();
   reset();

   lives--;
   if (lives <= 0) {
      // game over
      isDestructable = false;
      invincibleCount = 8000;
      ALLEGRO_BITMAP *old_target = al_get_target_bitmap();
      al_set_target_bitmap(highscoreBitmap);
      int w = al_get_bitmap_width(highscoreBitmap);
      int h = al_get_bitmap_height(highscoreBitmap);
      ResourceManager& rm = ResourceManager::getInstance();
      ALLEGRO_FONT *large_font = (ALLEGRO_FONT *)rm.getData(RES_LARGEFONT);
      ALLEGRO_FONT *small_font = (ALLEGRO_FONT *)rm.getData(RES_SMALLFONT);
      al_draw_textf(large_font, al_map_rgb(255, 255, 255), w/2, h/2-16, ALLEGRO_ALIGN_CENTRE, "GAME OVER");
      al_draw_textf(small_font, al_map_rgb(255, 255, 255), w/2, h/2+16, ALLEGRO_ALIGN_CENTRE, "%d Points", score);
      al_set_target_bitmap(old_target);
   }
   else {
      hp = 1;
      isDestructable = false;
      invincibleCount = 3000;
   }
}